

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opengltexture.h
# Opt level: O1

void __thiscall rengine::OpenGLTexture::upload(OpenGLTexture *this,int width,int height,void *data)

{
  if (this->m_id == 0) {
    glGenTextures(1,&this->m_id);
    glBindTexture(0xde1,this->m_id);
    glTexParameteri(0xde1,0x2801,0x2601);
  }
  else {
    glBindTexture(0xde1);
  }
  (this->m_size).x = (float)width;
  (this->m_size).y = (float)height;
  glTexImage2D(0xde1,0,0x1908,width,height,0,0x1908,0x1401,data);
  return;
}

Assistant:

void upload(int width, int height, void *data)
    {
        if (m_id == 0) {
            glGenTextures(1, &m_id);
            glBindTexture(GL_TEXTURE_2D, m_id);
            glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
        } else {
            glBindTexture(GL_TEXTURE_2D, m_id);
        }
        m_size = vec2(width, height);
        glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, width, height, 0, GL_RGBA, GL_UNSIGNED_BYTE, data);
    }